

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingExample.cpp
# Opt level: O0

int GetMapping<int>(int mapMe,vector<int,_std::allocator<int>_> *mappings)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  int local_20;
  value_type vStack_1c;
  bool keepLooking;
  int i;
  int result;
  vector<int,_std::allocator<int>_> *mappings_local;
  int mapMe_local;
  
  bVar2 = true;
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Mapping range: ");
  for (local_20 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(mappings),
      (ulong)(long)local_20 < sVar3; local_20 = local_20 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(mappings,(long)local_20);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
    std::operator<<(poVar5," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_20 = 0;
  vStack_1c = mapMe;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(mappings);
    bVar1 = false;
    if ((ulong)(long)local_20 < sVar3) {
      bVar1 = bVar2;
    }
    if (!bVar1) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(mappings,(long)local_20);
    if (*pvVar4 < mapMe) {
      local_20 = local_20 + 1;
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(mappings,(long)local_20);
      vStack_1c = *pvVar4;
      bVar2 = false;
    }
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,mapMe);
  poVar5 = std::operator<<(poVar5," is mapped to ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,vStack_1c);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return vStack_1c;
}

Assistant:

MapType GetMapping(MapType mapMe, vector<MapType> mappings){
   MapType result = mapMe;
   int i;
   bool keepLooking;

   keepLooking = true;

   cout << endl;
   cout << "Mapping range: ";
   for (i = 0; i < mappings.size(); ++i) {
      cout << mappings.at(i) << " ";
   }
   cout << endl;

   i = 0;       // Restart counting
   while ((i < mappings.size()) && keepLooking) {
      if(mapMe <= mappings.at(i)) {
         result = mappings.at(i);
         keepLooking = false;
      }
      else {
         ++i;
      }
   }

   cout << mapMe << " is mapped to " << result << endl;

   return result;
}